

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_relayer.cpp
# Opt level: O1

void __thiscall TcpRelayer::onAccept(TcpRelayer *this,Connection *conn)

{
  _Atomic_word *p_Var1;
  __suseconds_t _Var2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  TcpClient *this_00;
  TcpClient *pTVar4;
  int iVar5;
  TimerId TVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  RelayerContext context;
  shared_ptr<Liby::TcpClient> tcpClient;
  undefined1 local_78 [16];
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  Timestamp local_58;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  TcpClient *local_40 [2];
  
  Liby::EventLoopGroup::creatTcpClient
            ((EventLoopGroup *)local_40,(string *)this->group_,&this->host_);
  pTVar4 = local_40[1];
  this_00 = local_40[0];
  local_58.tv_.tv_sec = 8;
  local_58.tv_.tv_usec = 0;
  if (local_40[1] != (TcpClient *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)((long)local_40[1] + 8) = *(_Atomic_word *)((long)local_40[1] + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)((long)local_40[1] + 8) = *(_Atomic_word *)((long)local_40[1] + 8) + 1;
    }
  }
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = (_Invoker_type)0x0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._0_8_ = operator_new(0x10);
  *(TcpClient **)local_78._0_8_ = this_00;
  *(TcpClient **)(local_78._0_8_ + 8) = pTVar4;
  p_Stack_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_relayer.cpp:26:59)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_relayer.cpp:26:59)>
             ::_M_manager;
  TVar6 = Liby::TimerMixin::runAfter(&this_00->super_TimerMixin,&local_58,(BasicHandler *)local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
  }
  local_58.tv_.tv_sec = (__time_t)&PTR__RelayerContext_0012f160;
  local_58.tv_.tv_usec = 0;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Liby::Connection,void>
            ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_78,
             (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
             &conn->super_enable_shared_from_this<Liby::Connection>);
  local_58.tv_.tv_usec = local_78._0_8_;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&_Stack_48,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  _Var3._M_pi = _Stack_48._M_pi;
  _Var2 = local_58.tv_.tv_usec;
  if (_Stack_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_48._M_pi)->_M_weak_count = (_Stack_48._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_48._M_pi)->_M_weak_count = (_Stack_48._M_pi)->_M_weak_count + 1;
    }
  }
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = (_Invoker_type)0x0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._0_8_ = operator_new(0x28);
  *(TcpRelayer **)local_78._0_8_ = this;
  *(undefined ***)(local_78._0_8_ + 8) = &PTR__RelayerContext_0012f160;
  *(__suseconds_t *)(local_78._0_8_ + 0x10) = _Var2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78._0_8_ + 0x18) = _Var3._M_pi;
  *(TimerId *)(local_78._0_8_ + 0x20) = TVar6;
  p_Stack_60 = std::
               _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_relayer.cpp:30:30)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_relayer.cpp:30:30)>
             ::_M_manager;
  Liby::TcpClient::onConnect(local_40[0],(Connector *)local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
  }
  local_58.tv_.tv_sec = (__time_t)&PTR__RelayerContext_0012f160;
  if (_Stack_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(_Stack_48._M_pi)->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = (_Stack_48._M_pi)->_M_weak_count;
      (_Stack_48._M_pi)->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(_Stack_48._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_40[1] != (TcpClient *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40[1]);
  }
  return;
}

Assistant:

void onAccept(Connection &conn) {
        shared_ptr<TcpClient> tcpClient =
            group_.creatTcpClient(host_, service_);
        TimerId id = tcpClient->runAfter(Timestamp(8, 0), [tcpClient] {});

        RelayerContext context;
        context.weak_conn = conn.shared_from_this();
        tcpClient->onConnect([this, context, id](shared_ptr<Connection> c) {
            if (c && !context.weak_conn.expired()) {
                RelayerContext context1;
                context1.weak_conn = c;
                c->context_ = make_shared<RelayerContext>(context);
                auto c1 = context.weak_conn.lock();
                c1->context_ = make_shared<RelayerContext>(context1);

                c->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c1->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c1->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c->enableRead();
                c1->enableRead();

                return;
            }

            if (c) {
                c->destroy();
            }

            if (!context.weak_conn.expired()) {
                context.weak_conn.lock()->destroy();
            }
        });
    }